

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String testing::internal::FormatForComparisonFailureMessage<unsigned_long,unsigned_int>
                 (unsigned_long *value,uint *param_2)

{
  size_t extraout_RDX;
  char *in_RDI;
  String SVar1;
  unsigned_long *in_stack_00000158;
  string *in_stack_ffffffffffffffc8;
  String *in_stack_ffffffffffffffd0;
  
  PrintToString<unsigned_long>(in_stack_00000158);
  String::String(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = in_RDI;
  return SVar1;
}

Assistant:

String FormatForComparisonFailureMessage(const T1& value,
                                         const T2& /* other_operand */) {
  // C++Builder compiles this incorrectly if the namespace isn't explicitly
  // given.
  return ::testing::PrintToString(value);
}